

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ComputeGeneratedColumns(Parse *pParse,int iRegStore,Table *pTab)

{
  void *pvVar1;
  bool bVar2;
  Column *pCVar3;
  i16 iVar4;
  VdbeOp *pVVar5;
  Column *pCol_00;
  Expr *pExpr;
  int x;
  Column *pCol;
  char *zP4;
  int jj;
  int ii;
  VdbeOp *pOp;
  Column *pCStack_60;
  int eProgress;
  Column *pRedo;
  Walker w;
  int i;
  Table *pTab_local;
  int iRegStore_local;
  Parse *pParse_local;
  
  sqlite3TableAffinity(pParse->pVdbe,pTab,iRegStore);
  if ((pTab->tabFlags & 0x40) != 0) {
    pVVar5 = sqlite3VdbeGetLastOp(pParse->pVdbe);
    if (pVVar5->opcode == '`') {
      pvVar1 = (pVVar5->p4).p;
      zP4._0_4_ = 0;
      zP4._4_4_ = 0;
      while (*(char *)((long)pvVar1 + (long)(int)zP4) != '\0') {
        if ((pTab->aCol[zP4._4_4_].colFlags & 0x20) == 0) {
          if ((pTab->aCol[zP4._4_4_].colFlags & 0x40) != 0) {
            *(undefined1 *)((long)pvVar1 + (long)(int)zP4) = 0x40;
          }
          zP4._0_4_ = (int)zP4 + 1;
        }
        zP4._4_4_ = zP4._4_4_ + 1;
      }
    }
    else if (pVVar5->opcode == '_') {
      pVVar5->p3 = 1;
    }
  }
  for (w.u._4_4_ = 0; (int)w.u._4_4_ < (int)pTab->nCol; w.u._4_4_ = w.u._4_4_ + 1) {
    if ((pTab->aCol[(int)w.u._4_4_].colFlags & 0x60) != 0) {
      pTab->aCol[(int)w.u._4_4_].colFlags = pTab->aCol[(int)w.u._4_4_].colFlags | 0x80;
    }
  }
  w.pParse = (Parse *)exprColumnFlagUnion;
  w.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)0x0;
  w.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
  pParse->iSelfTab = -iRegStore;
  w._32_8_ = pTab;
  do {
    bVar2 = false;
    pCStack_60 = (Column *)0x0;
    for (w.u._4_4_ = 0; (int)w.u._4_4_ < (int)pTab->nCol; w.u._4_4_ = w.u._4_4_ + 1) {
      pCol_00 = pTab->aCol + (int)w.u._4_4_;
      pCVar3 = pCStack_60;
      if ((pCol_00->colFlags & 0x80) != 0) {
        pCol_00->colFlags = pCol_00->colFlags | 0x100;
        w.xSelectCallback2._4_2_ = 0;
        pExpr = sqlite3ColumnExpr(pTab,pCol_00);
        sqlite3WalkExpr((Walker *)&pRedo,pExpr);
        pCol_00->colFlags = pCol_00->colFlags & 0xfeff;
        pCVar3 = pCol_00;
        if ((w.xSelectCallback2._4_2_ & 0x80) == 0) {
          bVar2 = true;
          iVar4 = sqlite3TableColumnToStorage(pTab,(i16)w.u._4_4_);
          sqlite3ExprCodeGeneratedColumn(pParse,pTab,pCol_00,iVar4 + iRegStore);
          pCol_00->colFlags = pCol_00->colFlags & 0xff7f;
          pCVar3 = pCStack_60;
        }
      }
      pCStack_60 = pCVar3;
    }
  } while (pCStack_60 != (Column *)0x0 && bVar2);
  if (pCStack_60 != (Column *)0x0) {
    sqlite3ErrorMsg(pParse,"generated column loop on \"%s\"",pCStack_60->zCnName);
  }
  pParse->iSelfTab = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ComputeGeneratedColumns(
  Parse *pParse,    /* Parsing context */
  int iRegStore,    /* Register holding the first column */
  Table *pTab       /* The table */
){
  int i;
  Walker w;
  Column *pRedo;
  int eProgress;
  VdbeOp *pOp;

  assert( pTab->tabFlags & TF_HasGenerated );
  testcase( pTab->tabFlags & TF_HasVirtual );
  testcase( pTab->tabFlags & TF_HasStored );

  /* Before computing generated columns, first go through and make sure
  ** that appropriate affinity has been applied to the regular columns
  */
  sqlite3TableAffinity(pParse->pVdbe, pTab, iRegStore);
  if( (pTab->tabFlags & TF_HasStored)!=0 ){
    pOp = sqlite3VdbeGetLastOp(pParse->pVdbe);
    if( pOp->opcode==OP_Affinity ){
      /* Change the OP_Affinity argument to '@' (NONE) for all stored
      ** columns.  '@' is the no-op affinity and those columns have not
      ** yet been computed. */
      int ii, jj;
      char *zP4 = pOp->p4.z;
      assert( zP4!=0 );
      assert( pOp->p4type==P4_DYNAMIC );
      for(ii=jj=0; zP4[jj]; ii++){
        if( pTab->aCol[ii].colFlags & COLFLAG_VIRTUAL ){
          continue;
        }
        if( pTab->aCol[ii].colFlags & COLFLAG_STORED ){
          zP4[jj] = SQLITE_AFF_NONE;
        }
        jj++;
      }
    }else if( pOp->opcode==OP_TypeCheck ){
      /* If an OP_TypeCheck was generated because the table is STRICT,
      ** then set the P3 operand to indicate that generated columns should
      ** not be checked */
      pOp->p3 = 1;
    }
  }

  /* Because there can be multiple generated columns that refer to one another,
  ** this is a two-pass algorithm.  On the first pass, mark all generated
  ** columns as "not available".
  */
  for(i=0; i<pTab->nCol; i++){
    if( pTab->aCol[i].colFlags & COLFLAG_GENERATED ){
      testcase( pTab->aCol[i].colFlags & COLFLAG_VIRTUAL );
      testcase( pTab->aCol[i].colFlags & COLFLAG_STORED );
      pTab->aCol[i].colFlags |= COLFLAG_NOTAVAIL;
    }
  }

  w.u.pTab = pTab;
  w.xExprCallback = exprColumnFlagUnion;
  w.xSelectCallback = 0;
  w.xSelectCallback2 = 0;

  /* On the second pass, compute the value of each NOT-AVAILABLE column.
  ** Companion code in the TK_COLUMN case of sqlite3ExprCodeTarget() will
  ** compute dependencies and mark remove the COLSPAN_NOTAVAIL mark, as
  ** they are needed.
  */
  pParse->iSelfTab = -iRegStore;
  do{
    eProgress = 0;
    pRedo = 0;
    for(i=0; i<pTab->nCol; i++){
      Column *pCol = pTab->aCol + i;
      if( (pCol->colFlags & COLFLAG_NOTAVAIL)!=0 ){
        int x;
        pCol->colFlags |= COLFLAG_BUSY;
        w.eCode = 0;
        sqlite3WalkExpr(&w, sqlite3ColumnExpr(pTab, pCol));
        pCol->colFlags &= ~COLFLAG_BUSY;
        if( w.eCode & COLFLAG_NOTAVAIL ){
          pRedo = pCol;
          continue;
        }
        eProgress = 1;
        assert( pCol->colFlags & COLFLAG_GENERATED );
        x = sqlite3TableColumnToStorage(pTab, i) + iRegStore;
        sqlite3ExprCodeGeneratedColumn(pParse, pTab, pCol, x);
        pCol->colFlags &= ~COLFLAG_NOTAVAIL;
      }
    }
  }while( pRedo && eProgress );
  if( pRedo ){
    sqlite3ErrorMsg(pParse, "generated column loop on \"%s\"", pRedo->zCnName);
  }
  pParse->iSelfTab = 0;
}